

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRType * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRType>::allocate<>(ObjectPool<spirv_cross::SPIRType> *this)

{
  Vector<spirv_cross::SPIRType_*> *this_00;
  _Tuple_impl<0UL,_spirv_cross::SPIRType_*,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>
  _Var1;
  ulong uVar2;
  size_t sVar3;
  _Head_base<0UL,_spirv_cross::SPIRType_*,_false> _Var4;
  SPIRType *pSVar5;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
  if (sVar3 == 0) {
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
            .buffer_size;
    uVar2 = (ulong)(this->start_object_count << ((byte)sVar3 & 0x1f));
    _Var1.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRType_*,_false>)malloc(uVar2 * 0x150);
    if (_Var1.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl == (SPIRType *)0x0)
    {
      return (SPIRType *)0x0;
    }
    if (uVar2 != 0) {
      sVar3 = 0;
      _Var4._M_head_impl =
           (SPIRType *)_Var1.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRType_*,_0UL>::reserve(this_00,sVar3 + 1);
        sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.ptr[sVar3] = _Var4._M_head_impl;
        sVar3 = sVar3 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size = sVar3;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      sVar3 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar3 + 1);
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
    .ptr[sVar3]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRType_*,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRType_*,_false> =
         _Var1.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
    .buffer_size = sVar3 + 1;
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.ptr[sVar3 - 1];
    if (sVar3 == 0) goto LAB_002f6133;
  }
  else {
    pSVar5 = (this_00->super_VectorView<spirv_cross::SPIRType_*>).ptr[sVar3 - 1];
  }
  SmallVector<spirv_cross::SPIRType_*,_0UL>::resize(this_00,sVar3 - 1);
LAB_002f6133:
  memset(&(pSVar5->super_IVariant).self,0,0x138);
  (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d5290;
  pSVar5->width = 0;
  pSVar5->vecsize = 1;
  pSVar5->columns = 1;
  (pSVar5->array).super_VectorView<unsigned_int>.ptr = (uint *)&(pSVar5->array).stack_storage;
  (pSVar5->array).buffer_capacity = 8;
  (pSVar5->array_size_literal).super_VectorView<bool>.ptr =
       (bool *)&(pSVar5->array_size_literal).stack_storage;
  (pSVar5->array_size_literal).buffer_capacity = 8;
  pSVar5->pointer = false;
  pSVar5->storage = StorageClassGeneric;
  (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&(pSVar5->member_types).stack_storage;
  (pSVar5->member_types).buffer_capacity = 8;
  (pSVar5->member_type_index_redirection).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar5->member_type_index_redirection).stack_storage;
  (pSVar5->member_type_index_redirection).buffer_capacity = 8;
  (pSVar5->type_alias).id = 0;
  (pSVar5->member_name_cache)._M_h._M_buckets = &(pSVar5->member_name_cache)._M_h._M_single_bucket;
  (pSVar5->member_name_cache)._M_h._M_bucket_count = 1;
  (pSVar5->member_name_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pSVar5->member_name_cache)._M_h._M_element_count = 0;
  (pSVar5->member_name_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pSVar5->member_name_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (pSVar5->member_name_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}